

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseThread.cpp
# Opt level: O0

void __thiscall BaseThread::Start(BaseThread *this,int detach)

{
  int in_ESI;
  thread *in_RDI;
  BaseThread **unaff_retaddr;
  type *in_stack_00000008;
  thread *in_stack_00000010;
  thread *this_00;
  
  this_00 = in_RDI;
  std::thread::thread<void(BaseThread::*)(),BaseThread*,void>
            (in_stack_00000010,in_stack_00000008,unaff_retaddr);
  std::thread::operator=(this_00,in_RDI);
  std::thread::~thread((thread *)0x10a6fd);
  if (in_ESI != 0) {
    std::thread::detach();
  }
  return;
}

Assistant:

void BaseThread::Start(int detach) {
    thread = std::thread(&BaseThread::Run, this);

    if(detach) {
        thread.detach();
    }
}